

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.cpp
# Opt level: O2

void __thiscall Js::ConfigFlagsTable::SetAllParentFlagsAsDefaultValue(ConfigFlagsTable *this)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  Boolean value;
  FlagTypes FVar4;
  char *this_00;
  Flag flag;
  ulong uVar5;
  undefined8 *in_FS_OFFSET;
  
  puVar1 = (undefined4 *)*in_FS_OFFSET;
  uVar5 = 0;
  do {
    if (uVar5 == 0x1d6) {
      return;
    }
    if (this->flagIsParent[uVar5] == true) {
      flag = (Flag)uVar5;
      this_00 = (char *)(uVar5 & 0xffff);
      FVar4 = GetFlagType(flag);
      if (FVar4 != FlagBoolean) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar1 = 1;
        this_00 = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ConfigFlagsTable.cpp"
        ;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ConfigFlagsTable.cpp"
                                    ,0x1c4,"(this->GetFlagType(currentFlag) == FlagBoolean)",
                                    "only supporting boolean flags as parent flags");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar1 = 0;
      }
      value = GetDefaultValueAsBoolean((ConfigFlagsTable *)this_00,flag);
      SetAsBoolean(this,flag,value);
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

void
    ConfigFlagsTable::SetAllParentFlagsAsDefaultValue()
    {
        for (int i = 0; i < FlagCount; i++)
        {
            Flag currentFlag = (Flag) i;
            if (this->IsParentFlag(currentFlag))
            {
                // only supporting Boolean for now
                AssertMsg(this->GetFlagType(currentFlag) == FlagBoolean, "only supporting boolean flags as parent flags");

                Boolean defaultParentValue = this->GetDefaultValueAsBoolean(currentFlag);
                this->SetAsBoolean(currentFlag, defaultParentValue);
            }
        }
    }